

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

void Abc_NtkTimeScale(Abc_Ntk_t *pNtk,float Scale)

{
  void **ppvVar1;
  float *pfVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  int local_34;
  int i;
  Abc_Time_t *pTime;
  Abc_Time_t **ppTimes;
  Abc_Obj_t *pObj;
  float Scale_local;
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
    (pNtk->pManTime->tArrDef).Fall = Scale * (pNtk->pManTime->tArrDef).Fall;
    (pNtk->pManTime->tArrDef).Rise = Scale * (pNtk->pManTime->tArrDef).Rise;
    (pNtk->pManTime->tReqDef).Fall = Scale * (pNtk->pManTime->tReqDef).Fall;
    (pNtk->pManTime->tReqDef).Rise = Scale * (pNtk->pManTime->tReqDef).Rise;
    ppvVar1 = pNtk->pManTime->vArrs->pArray;
    for (local_34 = 0; iVar3 = Abc_NtkCiNum(pNtk), local_34 < iVar3; local_34 = local_34 + 1) {
      pAVar4 = Abc_NtkCi(pNtk,local_34);
      pfVar2 = (float *)ppvVar1[pAVar4->Id];
      pfVar2[1] = Scale * pfVar2[1];
      *pfVar2 = Scale * *pfVar2;
    }
    ppvVar1 = pNtk->pManTime->vReqs->pArray;
    for (local_34 = 0; iVar3 = Abc_NtkCoNum(pNtk), local_34 < iVar3; local_34 = local_34 + 1) {
      pAVar4 = Abc_NtkCo(pNtk,local_34);
      pfVar2 = (float *)ppvVar1[pAVar4->Id];
      pfVar2[1] = Scale * pfVar2[1];
      *pfVar2 = Scale * *pfVar2;
    }
  }
  return;
}

Assistant:

void Abc_NtkTimeScale( Abc_Ntk_t * pNtk, float Scale )
{
    Abc_Obj_t * pObj;
    Abc_Time_t ** ppTimes, * pTime;
    int i;
    if ( pNtk->pManTime == NULL )
        return;
    // arrival
    pNtk->pManTime->tArrDef.Fall *= Scale;
    pNtk->pManTime->tArrDef.Rise *= Scale;
    // departure
    pNtk->pManTime->tReqDef.Fall *= Scale;
    pNtk->pManTime->tReqDef.Rise *= Scale;
    // set the default timing
    ppTimes = (Abc_Time_t **)pNtk->pManTime->vArrs->pArray;
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        pTime = ppTimes[pObj->Id];
        pTime->Fall *= Scale;
        pTime->Rise *= Scale;
    }
    // set the default timing
    ppTimes = (Abc_Time_t **)pNtk->pManTime->vReqs->pArray;
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pTime = ppTimes[pObj->Id];
        pTime->Fall *= Scale;
        pTime->Rise *= Scale;
    }
}